

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kLiveConstraints.c
# Opt level: O0

Vec_Ptr_t * gatherMonotoneSignals(Aig_Man_t *pAig)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj;
  int i;
  Aig_Man_t *pAig_local;
  
  for (pObj._4_4_ = 0; iVar1 = Vec_PtrSize(pAig->vObjs), pObj._4_4_ < iVar1;
      pObj._4_4_ = pObj._4_4_ + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,pObj._4_4_);
    if ((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) {
      Aig_ObjPrint(pAig,pObj_00);
      printf("\n");
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t *gatherMonotoneSignals(Aig_Man_t *pAig)
{
    int i;
    Aig_Obj_t *pObj;

    Aig_ManForEachNode( pAig, pObj, i )
    {
        Aig_ObjPrint( pAig, pObj );
        printf("\n");
    }
    
    return NULL;
}